

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QTzTransition>::reallocateAndGrow
          (QArrayDataPointer<QTzTransition> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QTzTransition> *old)

{
  long lVar1;
  bool bVar2;
  QTzTransition *pQVar3;
  QPodArrayOps<QTzTransition> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<QTzTransition> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QTzTransition> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  QArrayDataPointer<QTzTransition> *in_stack_ffffffffffffff70;
  QArrayDataPointer<QTzTransition> *in_stack_ffffffffffffff78;
  QArrayDataPointer<QTzTransition> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach(in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QTzTransition> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (pQVar3 = data((QArrayDataPointer<QTzTransition> *)&stack0xffffffffffffffe0),
       pQVar3 == (QTzTransition *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_00756d04;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<QTzTransition> *)
                  operator->((QArrayDataPointer<QTzTransition> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QTzTransition> *)0x756c17);
        begin((QArrayDataPointer<QTzTransition> *)0x756c26);
        QtPrivate::QPodArrayOps<QTzTransition>::copyAppend
                  (this_00,(QTzTransition *)in_stack_ffffffffffffff78,
                   (QTzTransition *)in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QArrayDataPointer<QTzTransition> *)
             operator->((QArrayDataPointer<QTzTransition> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QTzTransition> *)0x756c5f);
        begin((QArrayDataPointer<QTzTransition> *)0x756c6e);
        QtPrivate::QPodArrayOps<QTzTransition>::moveAppend
                  ((QPodArrayOps<QTzTransition> *)in_stack_ffffffffffffff70,
                   (QTzTransition *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (QTzTransition *)0x756c8c);
      }
    }
    swap(in_stack_ffffffffffffff70,
         (QArrayDataPointer<QTzTransition> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff70,
           (QArrayDataPointer<QTzTransition> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff70);
    freeSpaceAtEnd(in_stack_ffffffffffffff78);
    QtPrivate::QPodArrayOps<QTzTransition>::reallocate
              ((QPodArrayOps<QTzTransition> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00756d04:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }